

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::shift_buckets(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                *this,size_t dist,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_2)

{
  value_type vVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  unsigned_long uVar5;
  size_type sVar6;
  size_type sVar7;
  MPI_Datatype poVar8;
  unsigned_long uVar9;
  ulong uVar10;
  reference pvVar11;
  MPI_Comm poVar12;
  ulong uVar13;
  long lVar14;
  ulong local_e0;
  size_t i;
  size_t local_split;
  int p2_1;
  size_t last_gl_idx;
  size_t first_gl_idx;
  int p1_1;
  int recv_cnt_1;
  size_t p2_recv_cnt;
  int p2;
  int recv_cnt;
  size_t p1_recv_cnt;
  size_t p1_gl_end;
  int p1;
  size_t right_first_gl_idx;
  undefined1 local_68 [4];
  int n_irecvs;
  MPI_Request recv_reqs [2];
  MPI_Datatype mpi_index_t;
  datatype mxxindex_t;
  size_t prev_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_B2_local;
  size_t dist_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  *this_local;
  
  uVar5 = mxx::partition::block_decomposition_buffered<unsigned_long>::excl_prefix_size(&this->part)
  ;
  sVar7 = this->local_size;
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->local_B);
  if (sVar7 != sVar6) {
    __assert_fail("local_size == local_B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x264,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                 );
  }
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(param_2);
  if (sVar7 != this->local_size) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(param_2);
    mxxindex_t.builtin = false;
    mxxindex_t._17_7_ = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (param_2,this->local_size,(value_type_conflict1 *)&mxxindex_t.builtin);
  }
  mxx::get_datatype<unsigned_long>();
  poVar8 = mxx::datatype::type((datatype *)&mpi_index_t);
  right_first_gl_idx._4_4_ = 0;
  if (uVar5 + dist < this->n) {
    iVar3 = mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                      (&this->part,uVar5 + dist);
    uVar9 = mxx::partition::block_decomposition_buffered<unsigned_long>::prefix_size
                      (&this->part,iVar3);
    uVar10 = uVar9 - (uVar5 + dist);
    iVar4 = mxx::comm::rank(&this->comm);
    if (iVar3 != iVar4) {
      iVar4 = std::numeric_limits<int>::max();
      if ((ulong)(long)iVar4 <= uVar10) {
        __assert_fail("p1_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x27c,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_2,0);
      poVar12 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
      right_first_gl_idx._4_4_ = 1;
      MPI_Irecv(pvVar11,uVar10 & 0xffffffff,poVar8,iVar3,2,poVar12,local_68);
    }
    if ((uVar10 < this->local_size) && (iVar3 != this->p + -1)) {
      uVar13 = this->local_size - uVar10;
      iVar4 = std::numeric_limits<int>::max();
      if ((ulong)(long)iVar4 <= uVar13) {
        __assert_fail("p2_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x28a,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_2,0);
      poVar12 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
      lVar14 = (long)right_first_gl_idx._4_4_;
      right_first_gl_idx._4_4_ = right_first_gl_idx._4_4_ + 1;
      MPI_Irecv(pvVar11 + uVar10,uVar13 & 0xffffffff,poVar8,iVar3 + 1,2,poVar12,
                local_68 + lVar14 * 8);
    }
  }
  if (dist <= (uVar5 + this->local_size) - 1) {
    first_gl_idx._0_4_ = -1;
    if (dist <= uVar5) {
      first_gl_idx._0_4_ =
           mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                     (&this->part,uVar5 - dist);
    }
    iVar3 = mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                      (&this->part,~dist + uVar5 + this->local_size);
    if ((int)first_gl_idx == iVar3) {
      i = 0;
    }
    else if ((int)first_gl_idx < 0) {
      i = dist - uVar5;
    }
    else {
      uVar9 = mxx::partition::block_decomposition_buffered<unsigned_long>::prefix_size
                        (&this->part,(int)first_gl_idx);
      i = (uVar9 + dist) - uVar5;
      iVar4 = mxx::comm::rank(&this->comm);
      if ((int)first_gl_idx == iVar4) {
        __assert_fail("p1 != comm.rank()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2a2,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->local_B,0);
      poVar12 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
      MPI_Send(pvVar11,i & 0xffffffff,poVar8,(int)first_gl_idx,2,poVar12);
    }
    iVar4 = mxx::comm::rank(&this->comm);
    if (iVar3 == iVar4) {
      if (i != dist) {
        __assert_fail("local_split == dist",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2b3,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      for (local_e0 = i; local_e0 < this->local_size; local_e0 = local_e0 + 1) {
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->local_B,local_e0);
        vVar1 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (param_2,local_e0 - i);
        *pvVar11 = vVar1;
      }
    }
    else {
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->local_B,0);
      sVar2 = this->local_size;
      poVar12 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
      MPI_Send(pvVar11 + i,(int)sVar2 - (int)i,poVar8,iVar3,2,poVar12);
    }
  }
  MPI_Waitall(right_first_gl_idx._4_4_,local_68,0);
  mxx::datatype::~datatype((datatype *)&mpi_index_t);
  return;
}

Assistant:

void shift_buckets(std::size_t dist, std::vector<index_t>& local_B2) {
    // get # elements to the left
    std::size_t prev_size = part.excl_prefix_size();
    assert(local_size == local_B.size());

    // init B2
    if (local_B2.size() != local_size){
        local_B2.clear();
        local_B2.resize(local_size, 0);
    }

    mxx::datatype mxxindex_t = mxx::get_datatype<index_t>();
    MPI_Datatype mpi_index_t = mxxindex_t.type();

    MPI_Request recv_reqs[2];
    int n_irecvs = 0;
    // receive elements from the right
    if (prev_size + dist < n) {
        std::size_t right_first_gl_idx = prev_size + dist;
        int p1 = part.target_processor(right_first_gl_idx);

        std::size_t p1_gl_end = part.prefix_size(p1);
        std::size_t p1_recv_cnt = p1_gl_end - right_first_gl_idx;

        if (p1 != comm.rank()) {
            // only receive if the source is not myself (i.e., `rank`)
            // [otherwise results are directly written instead of MPI_Sended]
            assert(p1_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p1_recv_cnt;
            MPI_Irecv(&local_B2[0],recv_cnt, mpi_index_t, p1,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }

        if (p1_recv_cnt < local_size && p1 != p-1) {
            // also receive from one more processor
            int p2 = p1+1;
            // since p2 has at least local_size - 1 elements and at least
            // one element came from p1, we can assume that the receive count
            // is our local size minus the already received elements
            std::size_t p2_recv_cnt = local_size - p1_recv_cnt;

            assert(p2_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p2_recv_cnt;
            // send to `p1` (which is necessarily different from `rank`)
            MPI_Irecv(&local_B2[0] + p1_recv_cnt, recv_cnt, mpi_index_t, p2,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }
    }

    // send elements to the left (split to at most 2 target processors)
    if (prev_size + local_size - 1 >= dist) {
        int p1 = -1;
        if (prev_size >= dist) {
            std::size_t first_gl_idx = prev_size - dist;
            p1 = part.target_processor(first_gl_idx);
        }
        std::size_t last_gl_idx = prev_size + local_size - 1 - dist;
        int p2 = part.target_processor(last_gl_idx);

        std::size_t local_split;
        if (p1 != p2) {
            // local start index of area for second processor
            if (p1 >= 0) {
                local_split = part.prefix_size(p1) + dist - prev_size;
                // send to first processor
                assert(p1 != comm.rank());
                MPI_Send(&local_B[0], local_split,
                         mpi_index_t, p1, PSAC_TAG_SHIFT, comm);
            } else {
                // p1 doesn't exist, then there is no prefix to add
                local_split = dist - prev_size;
            }
        } else {
            // only one target processor
            local_split = 0;
        }

        if (p2 != comm.rank()) {
            MPI_Send(&local_B[0] + local_split, local_size - local_split,
                     mpi_index_t, p2, PSAC_TAG_SHIFT, comm);
        } else {
            // in this case the split should be exactly at `dist`
            assert(local_split == dist);
            // locally reassign
            for (std::size_t i = local_split; i < local_size; ++i) {
                local_B2[i-local_split] = local_B[i];
            }
        }
    }

    // wait for successful receive:
    MPI_Waitall(n_irecvs, recv_reqs, MPI_STATUS_IGNORE);
}